

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_CLASS::Load
          (_Type_CLASS *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Memory *pMVar1;
  uint uVar2;
  int iVar3;
  uint id;
  Class *pCVar4;
  char *pcVar5;
  long *plVar6;
  long in_R8;
  code *local_270;
  code *local_220;
  code *local_1e0;
  code *local_1a0;
  Nullable<LiteScript::Variable> local_160;
  Variable local_140;
  uint local_130;
  uint local_12c;
  uint i_3;
  int cidx;
  Variable local_108;
  uint local_f4;
  undefined1 local_f0 [4];
  uint i_2;
  Variable local_d0;
  uint local_c0;
  char local_b9;
  uint i_1;
  uchar c;
  string key;
  Nullable<LiteScript::Variable> local_98;
  Variable local_78;
  uint local_68;
  uint local_64;
  uint i;
  uint sz;
  Class *C;
  allocator<LiteScript::Class> local_41;
  code *pcStack_40;
  allocator<LiteScript::Class> allocator;
  offset_in_Memory_to_subr caller_local;
  Object *object_local;
  istream *stream_local;
  _Type_CLASS *this_local;
  
  pcStack_40 = (code *)caller;
  Object::Reassign(object,(Type *)_type_class,0x478);
  std::allocator<LiteScript::Class>::allocator(&local_41);
  pCVar4 = Object::GetData<LiteScript::Class>(object);
  __gnu_cxx::new_allocator<LiteScript::Class>::construct<LiteScript::Class,LiteScript::Memory&>
            ((new_allocator<LiteScript::Class> *)&local_41,pCVar4,object->memory);
  _i = Object::GetData<LiteScript::Class>(object);
  local_64 = IStreamer::Read<unsigned_int>(stream);
  for (local_68 = 0; pCVar4 = _i, local_68 < local_64; local_68 = local_68 + 1) {
    pMVar1 = object->memory;
    plVar6 = (long *)((long)(pMVar1->arr)._M_elems + in_R8);
    if (((ulong)pcStack_40 & 1) == 0) {
      local_1a0 = pcStack_40;
    }
    else {
      local_1a0 = *(code **)(pcStack_40 + *plVar6 + -1);
    }
    uVar2 = (*local_1a0)(plVar6,stream);
    Memory::GetVariable(&local_98,pMVar1,uVar2);
    Nullable::operator_cast_to_Variable((Nullable *)&local_78);
    Class::Inherit(pCVar4,&local_78);
    Variable::~Variable(&local_78);
    Nullable<LiteScript::Variable>::~Nullable(&local_98);
  }
  std::__cxx11::string::string((string *)&i_1);
  local_64 = IStreamer::Read<unsigned_int>(stream);
  for (local_c0 = 0; local_c0 < local_64; local_c0 = local_c0 + 1) {
    std::__cxx11::string::clear();
    while( true ) {
      local_b9 = std::istream::get();
      pCVar4 = _i;
      if (local_b9 == '\0') break;
      std::__cxx11::string::operator+=((string *)&i_1,local_b9);
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pMVar1 = object->memory;
    plVar6 = (long *)((long)(pMVar1->arr)._M_elems + in_R8);
    if (((ulong)pcStack_40 & 1) == 0) {
      local_1e0 = pcStack_40;
    }
    else {
      local_1e0 = *(code **)(pcStack_40 + *plVar6 + -1);
    }
    uVar2 = (*local_1e0)(plVar6,stream);
    Memory::GetVariable((Nullable<LiteScript::Variable> *)local_f0,pMVar1,uVar2);
    Nullable::operator_cast_to_Variable((Nullable *)&local_d0);
    Class::AddStatic(pCVar4,pcVar5,&local_d0);
    Variable::~Variable(&local_d0);
    Nullable<LiteScript::Variable>::~Nullable((Nullable<LiteScript::Variable> *)local_f0);
  }
  local_64 = IStreamer::Read<unsigned_int>(stream);
  for (local_f4 = 0; local_f4 < local_64; local_f4 = local_f4 + 1) {
    std::__cxx11::string::clear();
    while( true ) {
      local_b9 = std::istream::get();
      pCVar4 = _i;
      if (local_b9 == '\0') break;
      std::__cxx11::string::operator+=((string *)&i_1,local_b9);
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pMVar1 = object->memory;
    plVar6 = (long *)((long)(pMVar1->arr)._M_elems + in_R8);
    if (((ulong)pcStack_40 & 1) == 0) {
      local_220 = pcStack_40;
    }
    else {
      local_220 = *(code **)(pcStack_40 + *plVar6 + -1);
    }
    uVar2 = (*local_220)(plVar6,stream);
    Memory::GetVariable((Nullable<LiteScript::Variable> *)&i_3,pMVar1,uVar2);
    Nullable::operator_cast_to_Variable((Nullable *)&local_108);
    Class::AddUnstatic(pCVar4,pcVar5,&local_108);
    Variable::~Variable(&local_108);
    Nullable<LiteScript::Variable>::~Nullable((Nullable<LiteScript::Variable> *)&i_3);
  }
  local_12c = IStreamer::Read<int>(stream);
  pCVar4 = _i;
  if (local_12c != 0xffffffff) {
    pcVar5 = Class::GetUnstaticName(_i,local_12c);
    Class::DefineConstructor(pCVar4,pcVar5);
  }
  for (local_130 = 0; local_130 < 0x21; local_130 = local_130 + 1) {
    iVar3 = std::istream::get();
    pCVar4 = _i;
    uVar2 = local_130;
    if (iVar3 != 0) {
      pMVar1 = object->memory;
      plVar6 = (long *)((long)(pMVar1->arr)._M_elems + in_R8);
      if (((ulong)pcStack_40 & 1) == 0) {
        local_270 = pcStack_40;
      }
      else {
        local_270 = *(code **)(pcStack_40 + *plVar6 + -1);
      }
      id = (*local_270)(plVar6,stream);
      Memory::GetVariable(&local_160,pMVar1,id);
      Nullable::operator_cast_to_Variable((Nullable *)&local_140);
      Class::AddOperator(pCVar4,uVar2,&local_140);
      Variable::~Variable(&local_140);
      Nullable<LiteScript::Variable>::~Nullable(&local_160);
    }
  }
  std::__cxx11::string::~string((string *)&i_1);
  std::allocator<LiteScript::Class>::~allocator(&local_41);
  return;
}

Assistant:

void LiteScript::_Type_CLASS::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::CLASS, sizeof(Class));
    std::allocator<Class> allocator;
    allocator.construct(&object.GetData<Class>(), object.memory);
    Class& C = object.GetData<Class>();
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++)
        C.Inherit(object.memory.GetVariable((object.memory.*caller)(stream)));
    std::string key;
    unsigned char c;
    sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++) {
        key.clear();
        while ((c = (unsigned char)stream.get()) != 0)
            key += c;
        C.AddStatic(key.c_str(), object.memory.GetVariable((object.memory.*caller)(stream)));
    }
    sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++) {
        key.clear();
        while ((c = (unsigned char)stream.get()) != 0)
            key += c;
        C.AddUnstatic(key.c_str(), object.memory.GetVariable((object.memory.*caller)(stream)));
    }
    int cidx = IStreamer::Read<int>(stream);
    if (cidx != -1)
        C.DefineConstructor(C.GetUnstaticName((unsigned int)cidx));
    for (unsigned int i = 0; i < Class::OperatorType::OP_TYPE_NUMBER; i++) {
        if (stream.get() != 0)
            C.AddOperator(i, object.memory.GetVariable((object.memory.*caller)(stream)));
    }
}